

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

bool __thiscall PStruct::ReadFields(PStruct *this,FSerializer *ar,void *addr)

{
  PClass *pPVar1;
  byte bVar2;
  int iVar3;
  PSymbol *pPVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  char *text;
  byte bVar6;
  char *pcVar7;
  char *format;
  bool bVar8;
  FName local_4c;
  char *local_48;
  void *local_40;
  PSymbolTable *local_38;
  
  local_40 = addr;
  local_48 = FSerializer::GetKey(ar);
  if (local_48 == (char *)0x0) {
    bVar6 = 0;
  }
  else {
    local_38 = &(this->super_PNamedType).super_PCompoundType.super_PType.Symbols;
    bVar6 = 0;
    text = local_48;
    do {
      local_4c.Index = FName::NameManager::FindName(&FName::NameData,text,true);
      pPVar4 = PSymbolTable::FindSymbol(local_38,&local_4c,true);
      pPVar1 = PField::RegistrationInfo.MyClass;
      if (pPVar4 == (PSymbol *)0x0) {
        pcVar7 = FName::NameData.NameArray[(this->super_PNamedType).TypeName.Index].Text;
        format = "Cannot find field %s in %s\n";
LAB_0037c226:
        DPrintf(1,format,text,pcVar7);
      }
      else {
        if ((pPVar4->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(pPVar4->super_PTypeBase).super_DObject._vptr_DObject)(pPVar4);
          (pPVar4->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar5 = (pPVar4->super_PTypeBase).super_DObject.Class;
        bVar8 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar1 && bVar8) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar8 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar1) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar8) {
          pcVar7 = FName::NameData.NameArray[(this->super_PNamedType).TypeName.Index].Text;
          format = "Symbol %s in %s is not a field\n";
          goto LAB_0037c226;
        }
        pPVar1 = pPVar4[1].super_PTypeBase.super_DObject.Class;
        bVar2 = (**(code **)(*(long *)&(pPVar1->super_PNativeStruct).super_PStruct.super_PNamedType.
                                       super_PCompoundType.super_PType.super_PTypeBase.super_DObject
                            + 0x50))
                          (pPVar1,ar,0,
                           (long)pPVar4[1].super_PTypeBase.super_DObject._vptr_DObject +
                           (long)local_40);
        bVar6 = bVar6 | bVar2;
      }
      text = FSerializer::GetKey(ar);
    } while (text != (char *)0x0);
  }
  return (bool)(local_48 == (char *)0x0 | bVar6 & 1);
}

Assistant:

bool PStruct::ReadFields(FSerializer &ar, void *addr) const
{
	bool readsomething = false;
	bool foundsomething = false;
	const char *label;
	while ((label = ar.GetKey()))
	{
		foundsomething = true;

		const PSymbol *sym = Symbols.FindSymbol(FName(label, true), true);
		if (sym == NULL)
		{
			DPrintf(DMSG_ERROR, "Cannot find field %s in %s\n",
				label, TypeName.GetChars());
		}
		else if (!sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			DPrintf(DMSG_ERROR, "Symbol %s in %s is not a field\n",
				label, TypeName.GetChars());
		}
		else
		{
			readsomething |= static_cast<const PField *>(sym)->Type->ReadValue(ar, nullptr,
				(BYTE *)addr + static_cast<const PField *>(sym)->Offset);
		}
	}
	return readsomething || !foundsomething;
}